

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<ST::string,void>(string *container,ostream *os)

{
  const_iterator pvVar1;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  string *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  string *container_local;
  
  std::operator<<(os,'{');
  __range3 = (string *)0x0;
  __end0 = ST::string::begin(container);
  pvVar1 = ST::string::end(container);
  do {
    if (__end0 == pvVar1) {
LAB_001f0cd7:
      if (__range3 != (string *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((__range3 != (string *)0x0) && (std::operator<<(os,','), __range3 == (string *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_001f0cd7;
    }
    std::operator<<(os,' ');
    UniversalPrint<char>(__end0,os);
    __range3 = (string *)((long)&(__range3->m_buffer).m_chars + 1);
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }